

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.cpp
# Opt level: O2

void * NortekDVLThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  double local_c28;
  double local_c20;
  interval local_c18;
  int local_c00;
  int local_bfc;
  interval local_bf8;
  interval local_be0;
  double local_bc8;
  CHRONO chrono_period;
  char szTemp [256];
  NMEADATA nmeadata;
  NORTEKDVL nortekdvl;
  char szSaveFilePath [256];
  
  memset(&nortekdvl,0,0x568);
  memset(&nmeadata,0,0x3d8);
  StartChrono(&chrono_period);
  local_c00 = 100;
  bVar2 = false;
  local_bfc = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      if (bPauseNortekDVL == 0) break;
      if (!bVar2) {
        puts("NortekDVL paused.");
        DisconnectNortekDVL(&nortekdvl);
      }
      if (bExit != 0) goto LAB_0017f645;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartNortekDVL == 0) {
      if (bVar2) goto LAB_0017efb9;
      iVar4 = GetNMEASentenceNortekDVL(&nortekdvl,&nmeadata);
      if (iVar4 == 0) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        auVar9._0_4_ = -(uint)(nortekdvl.bEnable_PD6_SA == 0);
        auVar9._4_4_ = -(uint)(nortekdvl.bEnable_PD6_TS == 0);
        auVar9._8_4_ = -(uint)(nortekdvl.bEnable_PD6_BI == 0);
        auVar9._12_4_ = -(uint)(nortekdvl.bEnable_PD6_BS == 0);
        iVar4 = movmskps(iVar4,auVar9);
        if (((iVar4 != 0xf) || (nortekdvl.bEnable_PD6_BE != 0)) || (nortekdvl.bEnable_PD6_BD != 0))
        {
          if ((~auVar9._0_4_ & 1) != 0) {
            local_c28 = fmod_2PI((1.5707963267948966 - nmeadata.Heading) - angle_env);
            interval::interval(&local_be0,&local_c28);
            local_c20 = -psi_ahrs_acc;
            interval::interval(&local_c18,&local_c20,&psi_ahrs_acc);
            operator+(&local_be0,&local_c18);
            interval::operator=((interval *)&psi_ahrs,&local_bf8);
            local_c28 = -nmeadata.Pitch;
            interval::interval(&local_be0,&local_c28);
            local_c20 = -theta_ahrs_acc;
            interval::interval(&local_c18,&local_c20,&theta_ahrs_acc);
            operator+(&local_be0,&local_c18);
            interval::operator=((interval *)&theta_ahrs,&local_bf8);
            interval::interval(&local_be0,&nmeadata.Roll);
            local_c28 = (double)((ulong)phi_ahrs_acc ^ (ulong)DAT_0018d0f0);
            interval::interval(&local_c18,&local_c28,&phi_ahrs_acc);
            operator+(&local_be0,&local_c18);
            interval::operator=((interval *)&phi_ahrs,&local_bf8);
          }
          if (nortekdvl.bEnable_PD6_BS != 0) {
            if (nmeadata.vstatus_ship == 'V') {
              local_be0.inf = -10000.0;
              local_c18.inf = 10000.0;
              interval::interval(&local_bf8,&local_be0.inf,&local_c18.inf);
              interval::operator=((interval *)&vrx_dvl,&local_bf8);
              local_be0.inf = -10000.0;
              local_c18.inf = 10000.0;
              interval::interval(&local_bf8,&local_be0.inf,&local_c18.inf);
              interval::operator=((interval *)&vry_dvl,&local_bf8);
              local_be0.inf = -10000.0;
              local_c18.inf = 10000.0;
              interval::interval(&local_bf8,&local_be0.inf,&local_c18.inf);
            }
            else {
              if (nmeadata.vstatus_ship != 'A') goto LAB_0017f534;
              interval::interval(&local_be0,&nmeadata.vl_ship);
              local_c28 = -dvl_acc;
              interval::interval(&local_c18,&local_c28,&dvl_acc);
              operator+(&local_be0,&local_c18);
              interval::operator=((interval *)&vrx_dvl,&local_bf8);
              local_c28 = -nmeadata.vt_ship;
              interval::interval(&local_be0,&local_c28);
              local_c20 = -dvl_acc;
              interval::interval(&local_c18,&local_c20,&dvl_acc);
              operator+(&local_be0,&local_c18);
              interval::operator=((interval *)&vry_dvl,&local_bf8);
              interval::interval(&local_be0,&nmeadata.vn_ship);
              local_c28 = (double)((ulong)dvl_acc ^ (ulong)DAT_0018d0f0);
              interval::interval(&local_c18,&local_c28,&dvl_acc);
              operator+(&local_be0,&local_c18);
            }
            interval::operator=((interval *)&vrz_dvl,&local_bf8);
          }
LAB_0017f534:
          if ((nortekdvl.bEnable_PD6_BE != 0) && (nmeadata.vstatus_earth == 'A')) {
            sog = nmeadata.SOG;
            local_c28 = fmod_2PI((1.5707963267948966 - nmeadata.COG) - angle_env);
            interval::interval(&local_be0,&local_c28);
            local_c20 = -3.141592653589793;
            local_bc8 = 3.141592653589793;
            interval::interval(&local_c18,&local_c20,&local_bc8);
            operator+(&local_be0,&local_c18);
            interval::operator=((interval *)&psi_dvl,&local_bf8);
          }
          if ((nortekdvl.bEnable_PD6_BD != 0) && (nmeadata.timesincelastgood < 4.0)) {
            altitude_AGL = nmeadata.Altitude_AGL;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_0017f62c;
      }
      puts("Connection to a NortekDVL lost.");
      DisconnectNortekDVL(&nortekdvl);
      lVar8 = (long)local_c00;
LAB_0017efd1:
      mSleep(lVar8);
      local_bfc = local_bfc + 1;
      if (ExitOnErrorCount <= local_bfc && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_0017f645:
        bVar3 = true;
        goto LAB_0017f648;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a NortekDVL.");
        DisconnectNortekDVL(&nortekdvl);
      }
      bRestartNortekDVL = 0;
LAB_0017efb9:
      iVar4 = ConnectNortekDVL(&nortekdvl,"NortekDVL0.txt");
      lVar8 = 1000;
      if (iVar4 != 0) goto LAB_0017efd1;
      local_c00 = nortekdvl.threadperiod;
      memset(&nmeadata,0,0x3d8);
      if (nortekdvl.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)nortekdvl.pfSaveFile);
        nortekdvl.pfSaveFile = (FILE *)0x0;
      }
      if (nortekdvl.bSaveRawData == 0) {
LAB_0017f62c:
        bVar3 = false;
        bVar2 = true;
      }
      else {
        if (nortekdvl.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"nortekdvl",10);
        }
        else {
          sprintf(szTemp,"%.127s",nortekdvl.szCfgFilePath);
        }
        sVar5 = strlen(szTemp);
        iVar4 = (int)sVar5 + 1;
        uVar7 = sVar5 & 0xffffffff;
        do {
          if ((int)uVar7 < 1) goto LAB_0017f11b;
          uVar1 = uVar7 - 1;
          iVar4 = iVar4 + -1;
          lVar8 = uVar7 - 1;
          uVar7 = uVar1;
        } while (szTemp[lVar8] != '.');
        if ((uVar1 != 0) && (iVar4 <= (int)sVar5)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar5 - (uVar1 & 0xffffffff));
        }
LAB_0017f11b:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar6 = strtimeex_fns();
        bVar3 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar6);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        nortekdvl.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
        bVar2 = true;
        if ((FILE *)nortekdvl.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create NortekDVL data file.");
          bVar3 = false;
          goto LAB_0017f648;
        }
      }
    }
    if (bExit != 0) {
LAB_0017f648:
      StopChronoQuick(&chrono_period);
      if (nortekdvl.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)nortekdvl.pfSaveFile);
        nortekdvl.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectNortekDVL(&nortekdvl);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE NortekDVLThread(void* pParam)
{
	NORTEKDVL nortekdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&nortekdvl, 0, sizeof(NORTEKDVL));

	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseNortekDVL)
		{
			if (bConnected)
			{
				printf("NortekDVL paused.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNortekDVL)
		{
			if (bConnected)
			{
				printf("Restarting a NortekDVL.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			bRestartNortekDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNortekDVL(&nortekdvl, "NortekDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nortekdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nortekdvl.pfSaveFile != NULL)
				{
					fclose(nortekdvl.pfSaveFile); 
					nortekdvl.pfSaveFile = NULL;
				}
				if ((nortekdvl.bSaveRawData)&&(nortekdvl.pfSaveFile == NULL)) 
				{
					if (strlen(nortekdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nortekdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nortekdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nortekdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nortekdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create NortekDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentenceNortekDVL(&nortekdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (nortekdvl.bEnable_PD6_SA||nortekdvl.bEnable_PD6_TS||nortekdvl.bEnable_PD6_BI||nortekdvl.bEnable_PD6_BS||
					nortekdvl.bEnable_PD6_BE||nortekdvl.bEnable_PD6_BD)
				{
					if (nortekdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (nortekdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (nortekdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (nortekdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NortekDVL lost.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
				mSleep(threadperiod);
			}
		}

		//printf("NortekDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (nortekdvl.pfSaveFile != NULL)
	{
		fclose(nortekdvl.pfSaveFile); 
		nortekdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNortekDVL(&nortekdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}